

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymf262.c
# Opt level: O2

void OPL3_STATUS_SET(OPL3 *chip,int flag)

{
  byte bVar1;
  
  bVar1 = (byte)flag & chip->statusmask | chip->status;
  chip->status = bVar1;
  if ('\0' < (char)bVar1) {
    chip->status = bVar1 | 0x80;
    if (chip->IRQHandler != (OPL3_IRQHANDLER)0x0) {
      (*chip->IRQHandler)(chip->IRQParam,'\x01');
      return;
    }
  }
  return;
}

Assistant:

INLINE void OPL3_STATUS_SET(OPL3 *chip,int flag)
{
	/* set status flag masking out disabled IRQs */
	chip->status |= (flag & chip->statusmask);
	if(!(chip->status & 0x80))
	{
		if(chip->status & 0x7f)
		{	/* IRQ on */
			chip->status |= 0x80;
			/* callback user interrupt handler (IRQ is OFF to ON) */
			if(chip->IRQHandler) (chip->IRQHandler)(chip->IRQParam,1);
		}
	}
}